

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O3

utf8char_t * VTuneChakraProfile::GetUrl(FunctionBody *body,size_t *urlBufferLength)

{
  char16_t *string;
  SourceContextInfo *pSVar1;
  size_t sVar2;
  HeapAllocator *this;
  utf8char_t *puVar3;
  uint cchSource;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pSVar1 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)body);
  puVar3 = "Dynamic code";
  if ((pSVar1->dwHostSourceContext != 0xffffffffffffffff) &&
     ((pSVar1->isHostDynamicDocument & 1U) == 0)) {
    pSVar1 = Js::FunctionProxy::GetSourceContextInfo((FunctionProxy *)body);
    string = (pSVar1->field_5).field_0.url;
    if (string != (char16_t *)0x0) {
      sVar2 = PAL_wcslen(string);
      cchSource = (uint)sVar2;
      if (0x55555554 < cchSource) {
        Math::DefaultOverflowPolicy();
      }
      data.plusSize = (size_t)(cchSource * 3 + 1);
      *urlBufferLength = data.plusSize;
      local_50 = (undefined1  [8])&unsigned_char::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.count = (size_t)anon_var_dwarf_32b4643;
      data.filename._0_4_ = 0xb0;
      this = Memory::HeapAllocator::TrackAllocInfo
                       (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_50);
      puVar3 = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(this,*urlBufferLength);
      if (puVar3 != (utf8char_t *)0x0) {
        utf8::EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)0>
                  (puVar3,*urlBufferLength,string,cchSource);
        return puVar3;
      }
    }
    puVar3 = (utf8char_t *)0x0;
  }
  return puVar3;
}

Assistant:

utf8char_t* VTuneChakraProfile::GetUrl(Js::FunctionBody* body, size_t* urlBufferLength )
{
    utf8char_t* utf8Url = NULL;
    if (!body->GetSourceContextInfo()->IsDynamic())
    {
        const wchar* url = body->GetSourceContextInfo()->url;
        if (url)
        {
            size_t urlCharLength = wcslen(url);
            charcount_t ccUrlCharLength = static_cast<charcount_t>(urlCharLength);
            ccUrlCharLength = min(ccUrlCharLength, UINT_MAX);       // Just truncate if it is too big

            *urlBufferLength = UInt32Math::MulAdd<3, 1>(ccUrlCharLength);
            utf8Url = HeapNewNoThrowArray(utf8char_t, *urlBufferLength);
            if (utf8Url)
            {
                utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::Cesu8>(utf8Url, *urlBufferLength, url, ccUrlCharLength);
            }
        }
    }
    else
    {
        utf8Url = (utf8char_t*)VTuneChakraProfile::DynamicCode;
    }
    return utf8Url;
}